

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fssimplewindow.cpp
# Opt level: O1

int FsStringToKeyCode(char *str)

{
  char cVar1;
  int i;
  int iVar2;
  long lVar3;
  int i_1;
  char **ppcVar4;
  char upper [256];
  char local_118 [256];
  
  if (str != (char *)0x0) {
    lVar3 = 0;
    do {
      cVar1 = str[lVar3];
      if (cVar1 == '\0') break;
      local_118[lVar3] = cVar1;
      local_118[lVar3 + 1] = '\0';
      if ((byte)(cVar1 + 0x9fU) < 0x1a) {
        local_118[lVar3] = cVar1 + -0x20;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0xff);
    ppcVar4 = keyCodeToStr;
    lVar3 = 0;
    do {
      iVar2 = strcmp(local_118,*ppcVar4);
      if (iVar2 == 0) goto LAB_001118af;
      lVar3 = lVar3 + 1;
      ppcVar4 = ppcVar4 + 1;
    } while (lVar3 != 0x65);
  }
  lVar3 = 0;
LAB_001118af:
  return (int)lVar3;
}

Assistant:

int FsStringToKeyCode(const char str[])
{
	if(nullptr==str)
	{
		return FSKEY_NULL;
	}

	char upper[256];
	for(int i=0; i<255 && 0!=str[i]; ++i)
	{
		upper[i  ]=str[i];
		upper[i+1]=0;
		if('a'<=upper[i] && upper[i]<='z')
		{
			upper[i]=upper[i]+'A'-'a';
		}
	}
	for(int i=0; i<FSKEY_NUM_KEYCODE; ++i)
	{
		if(0==strcmp(upper,keyCodeToStr[i]))
		{
			return i;
		}
	}
	return FSKEY_NULL;
}